

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O3

void __thiscall
cmsys::CommandLineArguments::Initialize(CommandLineArguments *this,int argc,char **argv)

{
  ulong uVar1;
  allocator<char> local_49;
  long *local_48 [2];
  long local_38 [2];
  
  std::vector<cmsys::String,_std::allocator<cmsys::String>_>::_M_erase_at_end
            ((vector<cmsys::String,_std::allocator<cmsys::String>_> *)this->Internals,
             (((_Vector_base<cmsys::String,_std::allocator<cmsys::String>_> *)&this->Internals->Argv
              )->_M_impl).super__Vector_impl_data._M_start);
  this->Internals->LastArgument = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_48,*argv,&local_49);
  std::__cxx11::string::operator=((string *)&this->Internals->Argv0,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (1 < argc) {
    uVar1 = 1;
    do {
      ProcessArgument(this,argv[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)argc != uVar1);
  }
  return;
}

Assistant:

void CommandLineArguments::Initialize(int argc, const char* const argv[])
{
  int cc;

  this->Initialize();
  this->Internals->Argv0 = argv[0];
  for (cc = 1; cc < argc; cc++) {
    this->ProcessArgument(argv[cc]);
  }
}